

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

void density::
     heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
     ::cancel_put_impl(ControlBlock *i_control_block)

{
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *this;
  void *i_dest;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *type_ptr;
  ControlBlock *i_control_block_local;
  
  this = type_after_control(i_control_block);
  i_dest = get_element(i_control_block);
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  ::destroy(this,i_dest);
  if ((i_control_block->m_next & 3) != 0) {
    density_tests::detail::assert_failed<>
              ("(i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0",
               anon_var_dwarf_12e55,0xb34);
  }
  i_control_block->m_next = i_control_block->m_next + 2;
  return;
}

Assistant:

DENSITY_NO_INLINE static void cancel_put_impl(ControlBlock * i_control_block)
        {
            const auto type_ptr = type_after_control(i_control_block);
            type_ptr->destroy(get_element(i_control_block));

            type_ptr->RUNTIME_TYPE::~RUNTIME_TYPE();

            DENSITY_ASSERT_INTERNAL(
              (i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0);
            i_control_block->m_next += detail::Queue_Dead;
        }